

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quich.c
# Opt level: O0

void printAll(char *func)

{
  char *local_18;
  char *statements;
  char *func_local;
  
  local_18 = strtok(func,";");
  while (local_18 != (char *)0x0) {
    printResult(local_18);
    local_18 = strtok((char *)0x0,";");
    if ((local_18 != (char *)0x0) && ((verbose & 1U) != 0)) {
      printf("\n");
    }
  }
  return;
}

Assistant:

static void printAll(char *func)
{
    char *statements = strtok(func, STMT_SEPARATOR);

    while (statements != NULL) {
        printResult(statements);
        statements = strtok(NULL, STMT_SEPARATOR);

        if (statements != NULL && verbose) {
            printf("\n");
        }
    }
}